

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
waitGLResults(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
              *this)

{
  RenderContext *context;
  PixelBufferAccess local_50;
  undefined1 local_28 [8];
  Surface dummySurface;
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
  *this_local;
  
  dummySurface.m_pixels.m_cap = (size_t)this;
  tcu::Surface::Surface((Surface *)local_28,0x20,0x20);
  context = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_50,(Surface *)local_28);
  glu::readPixels(context,0,0,&local_50);
  tcu::Surface::~Surface((Surface *)local_28);
  return;
}

Assistant:

void BasicBufferCase<SampleType>::waitGLResults (void)
{
	tcu::Surface dummySurface(DUMMY_RENDER_AREA_SIZE, DUMMY_RENDER_AREA_SIZE);
	glu::readPixels(m_context.getRenderContext(), 0, 0, dummySurface.getAccess());
}